

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamFtp::ConnectDataSocket(BamFtp *this)

{
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  long in_RDI;
  string retrieveCommand;
  string restartCommand;
  stringstream fpStream;
  string passiveCommand;
  string *in_stack_fffffffffffffcb8;
  undefined6 in_stack_fffffffffffffcc0;
  undefined1 in_stack_fffffffffffffcc6;
  undefined1 in_stack_fffffffffffffcc7;
  TcpSocket *in_stack_fffffffffffffcc8;
  undefined8 in_stack_fffffffffffffcd0;
  char __rhs;
  allocator *paVar4;
  undefined1 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcd9;
  undefined1 in_stack_fffffffffffffcda;
  undefined1 in_stack_fffffffffffffcdb;
  _Ios_Openmode in_stack_fffffffffffffcdc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  undefined7 in_stack_fffffffffffffcf8;
  allocator local_2f1;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [15];
  undefined1 in_stack_fffffffffffffd9f;
  string *in_stack_fffffffffffffda0;
  BamFtp *in_stack_fffffffffffffda8;
  string local_250 [8];
  BamFtp *in_stack_fffffffffffffdb8;
  string local_230 [32];
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [16];
  BamFtp *in_stack_fffffffffffffe28;
  stringstream local_1c8 [16];
  undefined1 local_1b8 [32];
  BamFtp *in_stack_fffffffffffffe68;
  OpenMode in_stack_fffffffffffffec0;
  uint16_t in_stack_fffffffffffffec6;
  string *in_stack_fffffffffffffec8;
  TcpSocket *in_stack_fffffffffffffed0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  byte local_1;
  
  __rhs = (char)((ulong)in_stack_fffffffffffffcd0 >> 0x38);
  bVar1 = TcpSocket::IsConnected(in_stack_fffffffffffffcc8);
  if ((!bVar1) && (bVar1 = ConnectCommandSocket(in_stack_fffffffffffffe68), !bVar1)) {
    local_1 = 0;
    goto LAB_001cae70;
  }
  bVar1 = TcpSocket::IsConnected(in_stack_fffffffffffffcc8);
  if (bVar1) {
    TcpSocket::DisconnectFromHost
              ((TcpSocket *)
               CONCAT17(in_stack_fffffffffffffcc7,
                        CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
  }
  __rhs_00 = &local_30;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
                 in_stack_fffffffffffffce0);
  uVar2 = SendCommand(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                      (bool)in_stack_fffffffffffffd9f);
  if ((bool)uVar2) {
    bVar1 = ParsePassiveResponse(in_stack_fffffffffffffe28);
    if (bVar1) {
      if (-1 < *(long *)(in_RDI + 0x118)) {
        paVar4 = &local_1e9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e8,"",paVar4);
        in_stack_fffffffffffffcdc = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_1c8,local_1e8,in_stack_fffffffffffffcdc);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        std::ostream::operator<<(local_1b8,*(long *)(in_RDI + 0x118));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffcdc,
                                CONCAT13(in_stack_fffffffffffffcdb,
                                         CONCAT12(in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8)))),__rhs);
        std::__cxx11::stringstream::str();
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffcf8),__rhs_00);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffcc8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffcc7,
                                CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_270);
        std::__cxx11::string::~string(local_250);
        in_stack_fffffffffffffcdb =
             SendCommand(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                         (bool)in_stack_fffffffffffffd9f);
        if (!(bool)in_stack_fffffffffffffcdb) {
          local_1 = 0;
        }
        bVar1 = !(bool)in_stack_fffffffffffffcdb;
        std::__cxx11::string::~string(local_210);
        std::__cxx11::stringstream::~stringstream(local_1c8);
        if (bVar1) goto LAB_001cae52;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffcdc,
                              CONCAT13(in_stack_fffffffffffffcdb,
                                       CONCAT12(in_stack_fffffffffffffcda,
                                                CONCAT11(in_stack_fffffffffffffcd9,
                                                         in_stack_fffffffffffffcd8)))),__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcc7,
                              CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffcc8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcc7,
                              CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
      std::__cxx11::string::~string(local_2b0);
      std::__cxx11::string::~string(local_2d0);
      bVar1 = SendCommand(in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                          (bool)in_stack_fffffffffffffd9f);
      if (bVar1) {
        bVar1 = TcpSocket::ConnectToHost
                          (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                           in_stack_fffffffffffffec6,in_stack_fffffffffffffec0);
        if (bVar1) {
          bVar1 = ReceiveReply(in_stack_fffffffffffffdb8);
          if (bVar1) {
            paVar4 = &local_2f1;
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2f0,"150",paVar4);
            uVar2 = startsWith((string *)
                               CONCAT17(in_stack_fffffffffffffcc7,
                                        CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0
                                                )),in_stack_fffffffffffffcb8);
            bVar3 = uVar2 ^ 0xff;
            std::__cxx11::string::~string(local_2f0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
            if ((bVar3 & 1) == 0) {
              local_1 = 1;
            }
            else {
              TcpSocket::DisconnectFromHost
                        ((TcpSocket *)CONCAT17(uVar2,CONCAT16(bVar3,in_stack_fffffffffffffcc0)));
              local_1 = 0;
            }
          }
          else {
            TcpSocket::DisconnectFromHost
                      ((TcpSocket *)
                       CONCAT17(in_stack_fffffffffffffcc7,
                                CONCAT16(in_stack_fffffffffffffcc6,in_stack_fffffffffffffcc0)));
            local_1 = 0;
          }
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
      std::__cxx11::string::~string(local_290);
    }
    else {
      local_1 = 0;
    }
  }
  else {
    local_1 = 0;
  }
LAB_001cae52:
  std::__cxx11::string::~string((string *)&local_30);
LAB_001cae70:
  return (bool)(local_1 & 1);
}

Assistant:

bool BamFtp::ConnectDataSocket(void) {

    // failure if can't connect to command socket first
    if ( !m_commandSocket->IsConnected() ) {
        if ( !ConnectCommandSocket() )
            return false;
    }

    // make sure we're starting with a fresh data channel
    if ( m_dataSocket->IsConnected() )
        m_dataSocket->DisconnectFromHost();

    // send passive connection command
    const string passiveCommand = PASV_CMD + FTP_NEWLINE;
    if ( !SendCommand(passiveCommand, true) ) {
        // TODO: set error string
        return false;
    }

    // retrieve passive connection port
    if ( !ParsePassiveResponse() ) {
        // TODO: set error string
        return false;
    }

    // set up restart command (tell server where to start fetching bytes from)
    if ( m_filePosition >= 0 ) {

        stringstream fpStream("");
        fpStream << m_filePosition;
        string restartCommand = REST_CMD + CMD_SEPARATOR + fpStream.str() + FTP_NEWLINE;
        if ( !SendCommand(restartCommand, true) ) {
            // TODO: set error string
            return false;
        }
    }

    // main file retrieval request
    string retrieveCommand = RETR_CMD + CMD_SEPARATOR + m_filename + FTP_NEWLINE;
    if ( !SendCommand(retrieveCommand, false) ) {
        // TODO: set error string
        return false;
    }

    // make data channel connection
    if ( !m_dataSocket->ConnectToHost(m_dataHostname, m_dataPort) ) {
        // TODO: set error string
        return false;
    }

    // fetch intial reply from server
    if ( !ReceiveReply() ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // make sure we have reply code 150 (all good)
    if ( !startsWith(m_response, "150") ) {
        // TODO: set error string
        m_dataSocket->DisconnectFromHost();
        return false;
    }

    // return success
    return true;
}